

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.cc
# Opt level: O1

void __thiscall
dynet::PickRange::backward_dev_impl<dynet::Device_CPU>
          (PickRange *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  DefaultDevice *device;
  uint uVar4;
  long lVar5;
  uint uVar6;
  type *ptVar7;
  uint uVar8;
  type *ptVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  ulong local_1d0;
  undefined1 auStack_1c8 [16];
  ulong uStack_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  long local_188;
  TensorAssignOp<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_5>,_const_Eigen::DSizes<long,_5>,_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_5>,_const_Eigen::DSizes<long,_5>,_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>_>
  local_178;
  type local_168;
  type local_e8;
  
  local_198 = (undefined1  [16])0x0;
  local_1a8 = (undefined1  [16])0x0;
  local_188 = 0;
  uVar1 = this->start;
  uVar4 = this->dim;
  *(ulong *)(local_1a8 + (ulong)uVar4 * 8) = (ulong)uVar1;
  uVar2 = (fx->d).nd;
  local_1b0 = (ulong)(fx->d).bd;
  uVar6 = 1;
  uVar8 = (fx->d).d[0];
  if (uVar2 == 0) {
    uVar8 = 1;
  }
  local_1d0 = (ulong)uVar8;
  uVar8 = (fx->d).d[3];
  if (uVar2 < 4) {
    uVar8 = 1;
  }
  uStack_1b8 = (ulong)uVar8;
  auVar13._0_8_ =
       CONCAT44(-(uint)(-0x7ffffffe < (int)(uVar2 ^ 0x80000000)),
                -(uint)(-0x7fffffff < (int)(uVar2 ^ 0x80000000)));
  auVar13._8_4_ = 0;
  auVar14._8_4_ = 0;
  auVar14._0_8_ = *(ulong *)((fx->d).d + 1) & auVar13._0_8_;
  auVar14 = ~auVar13 & DAT_0045e510._0_12_ | auVar14;
  auStack_1c8._0_8_ = auVar14._0_8_ & 0xffffffff;
  auStack_1c8._8_4_ = auVar14._4_4_;
  auStack_1c8._12_4_ = 0;
  *(ulong *)(auStack_1c8 + (ulong)uVar4 * 8 + -8) = (ulong)(this->end - uVar1);
  uVar1 = (dEdf->d).nd;
  if (uVar1 == 2) {
    if (1 < uVar1) {
      uVar6 = (dEdf->d).d[1];
    }
    uVar4 = (dEdf->d).d[0];
    lVar11 = (long)(int)uVar6;
    lVar10 = 1;
  }
  else if (uVar1 == 3) {
    uVar4 = (dEdf->d).d[0];
    lVar11 = (long)(int)(dEdf->d).d[1];
    lVar10 = (long)(int)(dEdf->d).d[2];
  }
  else {
    if (uVar1 == 4) {
      uVar4 = (dEdf->d).d[0];
      lVar11 = (long)(int)(dEdf->d).d[1];
      lVar10 = (long)(int)(dEdf->d).d[2];
      lVar12 = (long)(int)(dEdf->d).d[3];
      goto LAB_003f061c;
    }
    uVar4 = 1;
    if (uVar1 != 0) {
      uVar4 = (dEdf->d).d[0];
    }
    lVar10 = 1;
    lVar11 = 1;
  }
  lVar12 = 1;
LAB_003f061c:
  uVar1 = (dEdf->d).bd;
  pfVar3 = dEdf->v;
  uVar2 = (dEdxi->d).nd;
  if (uVar2 == 2) {
    uVar6 = 1;
    if (1 < uVar2) {
      uVar6 = (dEdxi->d).d[1];
    }
    uVar8 = (dEdxi->d).d[0];
    local_168.m_xpr.m_dimensions.super_array<long,_5>._M_elems[1] = (long)(int)uVar6;
    local_168.m_xpr.m_dimensions.super_array<long,_5>._M_elems[3] = 1;
    local_168.m_xpr.m_dimensions.super_array<long,_5>._M_elems[2] = 1;
  }
  else if (uVar2 == 3) {
    uVar8 = (dEdxi->d).d[0];
    local_168.m_xpr.m_dimensions.super_array<long,_5>._M_elems[1] = (long)(int)(dEdxi->d).d[1];
    local_168.m_xpr.m_dimensions.super_array<long,_5>._M_elems[2] = (long)(int)(dEdxi->d).d[2];
    local_168.m_xpr.m_dimensions.super_array<long,_5>._M_elems[3] = 1;
  }
  else if (uVar2 == 4) {
    uVar8 = (dEdxi->d).d[0];
    local_168.m_xpr.m_dimensions.super_array<long,_5>._M_elems[1] = (long)(int)(dEdxi->d).d[1];
    local_168.m_xpr.m_dimensions.super_array<long,_5>._M_elems[2] = (long)(int)(dEdxi->d).d[2];
    local_168.m_xpr.m_dimensions.super_array<long,_5>._M_elems[3] = (long)(int)(dEdxi->d).d[3];
  }
  else {
    uVar8 = 1;
    if (uVar2 != 0) {
      uVar8 = (dEdxi->d).d[0];
    }
    local_168.m_xpr.m_dimensions.super_array<long,_5>._M_elems[3] = 1;
    local_168.m_xpr.m_dimensions.super_array<long,_5>._M_elems[2] = 1;
    local_168.m_xpr.m_dimensions.super_array<long,_5>._M_elems[1] = 1;
  }
  local_178.m_lhs_xpr = &local_168;
  local_168.m_xpr.m_data = dEdxi->v;
  local_168.m_xpr.m_dimensions.super_array<long,_5>._M_elems[0] = (long)(int)uVar8;
  local_168.m_xpr.m_dimensions.super_array<long,_5>._M_elems[4] = (long)(int)(dEdxi->d).bd;
  local_168.m_indices.super_array<long,_5>._M_elems[0] = local_1a8._0_8_;
  local_168.m_indices.super_array<long,_5>._M_elems[1] = local_1a8._8_8_;
  local_168.m_indices.super_array<long,_5>._M_elems[2] = local_198._0_8_;
  local_168.m_indices.super_array<long,_5>._M_elems[3] = local_198._8_8_;
  local_168.m_indices.super_array<long,_5>._M_elems[4] = local_188;
  local_168.m_sizes.super_array<long,_5>._M_elems[0] = local_1d0;
  local_168.m_sizes.super_array<long,_5>._M_elems[1] = auStack_1c8._0_8_;
  local_168.m_sizes.super_array<long,_5>._M_elems[2] = auStack_1c8._8_8_;
  local_168.m_sizes.super_array<long,_5>._M_elems[3] = uStack_1b8;
  local_168.m_sizes.super_array<long,_5>._M_elems[4] = local_1b0;
  device = dev->edevice;
  local_178.m_rhs_xpr = &local_e8;
  ptVar7 = local_178.m_lhs_xpr;
  ptVar9 = local_178.m_rhs_xpr;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    (ptVar9->m_lhs_xpr).m_xpr.m_data = (ptVar7->m_xpr).m_data;
    ptVar7 = (type *)&(ptVar7->m_xpr).m_dimensions;
    ptVar9 = (type *)&(ptVar9->m_lhs_xpr).m_xpr.m_dimensions;
  }
  local_e8.m_rhs_xpr.m_data = pfVar3;
  local_e8.m_rhs_xpr.m_dimensions.super_array<long,_5>._M_elems[0] = (long)(int)uVar4;
  local_e8.m_rhs_xpr.m_dimensions.super_array<long,_5>._M_elems[1] = lVar11;
  local_e8.m_rhs_xpr.m_dimensions.super_array<long,_5>._M_elems[2] = lVar10;
  local_e8.m_rhs_xpr.m_dimensions.super_array<long,_5>._M_elems[3] = lVar12;
  local_e8.m_rhs_xpr.m_dimensions.super_array<long,_5>._M_elems[4] = (long)(int)uVar1;
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_5>,_const_Eigen::DSizes<long,_5>,_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_5>,_const_Eigen::DSizes<long,_5>,_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
  ::run(&local_178,device);
  return;
}

Assistant:

void PickRange::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  Eigen::DSizes<ptrdiff_t, 5> indices(0,0,0,0,0);
  indices[dim] = start;
  Eigen::DSizes<ptrdiff_t, 5> sizes(static_cast<ptrdiff_t>(fx.d[0]), 
                                    static_cast<ptrdiff_t>(fx.d[1]),
                                    static_cast<ptrdiff_t>(fx.d[2]),
                                    static_cast<ptrdiff_t>(fx.d[3]),
                                    static_cast<ptrdiff_t>(fx.d.bd));
  sizes[dim] = end-start;
  dEdxi.tb<4>().slice(indices, sizes).device(*dev.edevice) += dEdf.tb<4>();
}